

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::json_abi_v3_11_2::detail::input_stream_adapter::~input_stream_adapter
          (input_stream_adapter *this)

{
  istream *piVar1;
  undefined8 uVar2;
  _Ios_Iostate __a;
  input_stream_adapter *this_local;
  
  if (this->is != (istream *)0x0) {
    piVar1 = this->is;
    uVar2 = *(undefined8 *)(*(long *)piVar1 + -0x18);
    __a = std::ios::rdstate();
    std::operator&(__a,_S_eofbit);
    std::ios::clear((int)piVar1 + (int)uVar2);
  }
  return;
}

Assistant:

~input_stream_adapter()
    {
        // clear stream flags; we use underlying streambuf I/O, do not
        // maintain ifstream flags, except eof
        if (is != nullptr)
        {
            is->clear(is->rdstate() & std::ios::eofbit);
        }
    }